

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O3

void __thiscall fmp4_stream::mfhd::print(mfhd *this)

{
  long lVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=================mfhd==================",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  lVar1 = std::cout;
  *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
       *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," sequence number is: ",0x15);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void mfhd::print() const
	{
		std::cout << "=================mfhd==================" << std::endl;
		std::cout << std::setw(33) << std::left << " sequence number is: " << seq_nr_ << std::endl;
	}